

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O0

bool parse_pattern(GlobalVars *gv,char *keyword,char **fpat,char ***spatlist)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  void *pvVar6;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  char *in_RSI;
  long in_RDI;
  bool sortsec;
  int pcnt;
  char *patternlist [64];
  char *sortcmd;
  char **in_stack_fffffffffffffd88;
  char *in_stack_fffffffffffffd90;
  char *pcVar7;
  int local_23c;
  long local_238 [19];
  char *local_18;
  bool local_4;
  
  local_23c = 0;
  *(byte *)(in_RDI + 0x260) = *(byte *)(in_RDI + 0x260) & 0xf8;
  iVar3 = strcmp(in_RSI,"KEEP");
  local_18 = in_RSI;
  if (iVar3 == 0) {
    local_18 = getpattern();
    pcVar7 = scriptname;
    if (local_18 == (char *)0x0) {
      uVar4 = getlineno();
      error(0x4e,pcVar7,(ulong)uVar4);
      return 0;
    }
    cVar2 = getchr();
    pcVar7 = scriptname;
    if (cVar2 != '(') {
      uVar4 = getlineno();
      error(0x42,pcVar7,(ulong)uVar4,0x28);
      back(1);
      return 0;
    }
    *(byte *)(in_RDI + 0x260) = *(byte *)(in_RDI + 0x260) | 1;
  }
  iVar3 = strcmp(local_18,"SORT");
  if (iVar3 == 0) {
    local_18 = getpattern();
    pcVar7 = scriptname;
    if (local_18 == (char *)0x0) {
      uVar4 = getlineno();
      error(0x4e,pcVar7,(ulong)uVar4);
      return 0;
    }
    cVar2 = getchr();
    pcVar7 = scriptname;
    if (cVar2 != '(') {
      uVar4 = getlineno();
      error(0x42,pcVar7,(ulong)uVar4,0x28);
      back(1);
      return 0;
    }
    *(byte *)(in_RDI + 0x260) = *(byte *)(in_RDI + 0x260) | 2;
  }
  strlen(local_18);
  pvVar6 = alloc((size_t)in_stack_fffffffffffffd90);
  *in_RDX = pvVar6;
  strcpy((char *)*in_RDX,local_18);
  if (((*(byte *)(in_RDI + 0x260) & 2) == 0) ||
     (bVar5 = endofblock((char)((ulong)in_stack_fffffffffffffd90 >> 0x18),
                         (char)((ulong)in_stack_fffffffffffffd90 >> 0x10)), bVar5 != 0)) {
    while (local_18 = getpattern(), local_18 != (char *)0x0) {
      bVar1 = false;
      iVar3 = strcmp(local_18,"SORT");
      if (iVar3 == 0) {
        cVar2 = getchr();
        if (cVar2 != '(') {
          pcVar7 = scriptname;
          uVar4 = getlineno();
          error(0x42,pcVar7,(ulong)uVar4,0x28);
          back(1);
          free((void *)*in_RDX);
          return 0;
        }
        local_18 = getpattern();
        pcVar7 = scriptname;
        if (local_18 == (char *)0x0) {
          uVar4 = getlineno();
          error(0x4e,pcVar7,(ulong)uVar4);
          free((void *)*in_RDX);
          return 0;
        }
        bVar5 = endofblock((char)((ulong)in_stack_fffffffffffffd90 >> 0x18),
                           (char)((ulong)in_stack_fffffffffffffd90 >> 0x10));
        if (bVar5 == 0) {
          free((void *)*in_RDX);
          return 0;
        }
        *(byte *)(in_RDI + 0x260) = *(byte *)(in_RDI + 0x260) | 4;
        bVar1 = true;
      }
      if (local_23c < 0x3f) {
        strlen(local_18);
        pvVar6 = alloc((size_t)in_stack_fffffffffffffd90);
        local_238[local_23c] = (long)pvVar6;
        if (bVar1) {
          *(undefined1 *)local_238[local_23c] = 0x24;
          strcpy((char *)(local_238[local_23c] + 1),local_18);
        }
        else {
          strcpy((char *)local_238[local_23c],local_18);
        }
        local_23c = local_23c + 1;
      }
      else {
        ierror("parse_pattern(): pattern buffer overrun");
      }
    }
    local_238[local_23c] = 0;
    pvVar6 = alloc((size_t)in_stack_fffffffffffffd90);
    *in_RCX = pvVar6;
    memcpy((void *)*in_RCX,local_238,(long)(local_23c + 1) << 3);
    bVar5 = endofblock((char)((ulong)in_stack_fffffffffffffd90 >> 0x18),
                       (char)((ulong)in_stack_fffffffffffffd90 >> 0x10));
    if (bVar5 == 0) {
      free_patterns(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      local_4 = 0;
    }
    else if (((*(byte *)(in_RDI + 0x260) & 1) == 0) ||
            (bVar5 = endofblock((char)((ulong)in_stack_fffffffffffffd90 >> 0x18),
                                (char)((ulong)in_stack_fffffffffffffd90 >> 0x10)), bVar5 != 0)) {
      local_4 = 1;
    }
    else {
      free_patterns(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      local_4 = 0;
    }
  }
  else {
    free((void *)*in_RDX);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static bool parse_pattern(struct GlobalVars *gv,char *keyword,
                          char **fpat,char ***spatlist)
/* parse file/section-pattern and allocate pattern-lists */
{
  const char *sortcmd = "SORT";
  char *patternlist[64];   /* yes... it's ugly :| */
  int pcnt = 0;
  bool sortsec;

  gv->scriptflags &= ~(LDSF_KEEP | LDSF_SORTFIL | LDSF_SORTSEC);
  if (!strcmp(keyword,"KEEP")) {
    if (keyword = getpattern()) {
      if (getchr() != '(') {
        error(66,scriptname,getlineno(),'(');  /* '(' expected */
        back(1);
        return FALSE;
      }
    }
    else {
      error(78,scriptname,getlineno());   /* missing argument */
      return FALSE;
    }
    gv->scriptflags |= LDSF_KEEP;
  }

  if (!strcmp(keyword,sortcmd)) {
    if (keyword = getpattern()) {
      if (getchr() != '(') {
        error(66,scriptname,getlineno(),'(');  /* '(' expected */
        back(1);
        return FALSE;
      }
    }
    else {
      error(78,scriptname,getlineno());   /* missing argument */
      return FALSE;
    }
    gv->scriptflags |= LDSF_SORTFIL;
  }
  *fpat = alloc(strlen(keyword)+1);
  strcpy(*fpat,keyword);
  if (gv->scriptflags & LDSF_SORTFIL) {
    if (!endofblock('(',')')) {
      free(*fpat);
      return FALSE;
    }
  }

  while (keyword = getpattern()) {
    sortsec = FALSE;
    if (!strcmp(keyword,sortcmd)) {
      if (getchr() == '(') {
        if (!(keyword = getpattern())) {
          error(78,scriptname,getlineno());   /* missing argument */
          free(*fpat);
          return FALSE;
        }
      }
      else {
        error(66,scriptname,getlineno(),'(');  /* '(' expected */
        back(1);
        free(*fpat);
        return FALSE;
      }
      if (!endofblock('(',')')) {
        free(*fpat);
        return FALSE;
      }
      gv->scriptflags |= LDSF_SORTSEC;
      sortsec = TRUE;
    }

    if (pcnt < 63) {
      patternlist[pcnt] = alloc(strlen(keyword) + (sortsec ? 2 : 1));
      if (sortsec) {
        *patternlist[pcnt] = '$';   /* indicate sort-request */
        strcpy(patternlist[pcnt]+1,keyword);
      }
      else
        strcpy(patternlist[pcnt],keyword);
      pcnt++;
    }
    else
      ierror("parse_pattern(): pattern buffer overrun");
  }

  patternlist[pcnt++] = NULL;
  *spatlist = alloc(pcnt * sizeof(char *));
  memcpy(*spatlist,patternlist,pcnt*sizeof(char *));

  if (!endofblock('(',')')) {
    free_patterns(*fpat,*spatlist);
    return FALSE;
  }
  if (gv->scriptflags & LDSF_KEEP) {
    if (!endofblock('(',')')) {
      free_patterns(*fpat,*spatlist);
      return FALSE;
    }
  }
  return TRUE;
}